

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

longdouble * __thiscall PrimitiveTestClass::FillValues<long_double*>(PrimitiveTestClass *this)

{
  longdouble *plVar1;
  longdouble *plVar2;
  long lVar3;
  ulong uVar4;
  
  lVar3 = (long)this->SIZE;
  uVar4 = 0xffffffffffffffff;
  if (-1 < lVar3) {
    uVar4 = lVar3 << 4;
  }
  plVar1 = (longdouble *)operator_new__(uVar4);
  if (lVar3 != 0) {
    plVar2 = plVar1;
    do {
      *plVar2 = (longdouble)255.0;
      plVar2 = plVar2 + 1;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  return plVar1;
}

Assistant:

T FillValues()
        {
            T ret = new typename std::remove_pointer<T>::type[SIZE];
            for (size_t i = 0; i < SIZE; i++)
            {
                ret[i] = 0xFF;
            }
            
            return ret;
        }